

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# empty.h
# Opt level: O2

bool ezy::detail::
     impl_empty<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::concatenated_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>,ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[3]>>const>,ezy::to_string_fn_const&>>
               (long *t)

{
  bool bVar1;
  iterator_concatenator<const_int[3],_const_int[3]> local_50;
  long local_30;
  iterator_concatenator<const_int[3],_const_int[3]> local_28;
  long local_8;
  
  local_30 = t[1];
  local_50.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
  .super__Head_base<0UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl._M_data =
       *(reference_wrapper<const_int[3]> *)*t;
  local_50.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<const_int[3]>_>.
  super__Head_base<1UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl._M_data =
       (_Head_base<1UL,_std::reference_wrapper<const_int[3]>,_false>)
       ((reference_wrapper<const_int[3]> *)((long *)*t + 1))->_M_data;
  local_50.tracker.current.super__Tuple_impl<0UL,_const_int_*,_const_int_*>.
  super__Tuple_impl<1UL,_const_int_*>.super__Head_base<1UL,_const_int_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_int_*,_false>)
       ((long)local_50.tracker.ranges.
              super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
              .super__Tuple_impl<1UL,_std::reference_wrapper<const_int[3]>_>.
              super__Head_base<1UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl.
              _M_data + 0xc);
  local_50.tracker.current.super__Tuple_impl<0UL,_const_int_*,_const_int_*>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl =
       (int *)((long)local_50.tracker.ranges.
                     super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
                     .super__Head_base<0UL,_std::reference_wrapper<const_int[3]>,_false>.
                     _M_head_impl._M_data + 0xc);
  local_28.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
  .super__Tuple_impl<1UL,_std::reference_wrapper<const_int[3]>_>.
  super__Head_base<1UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl._M_data =
       local_50.tracker.ranges.
       super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
       .super__Tuple_impl<1UL,_std::reference_wrapper<const_int[3]>_>.
       super__Head_base<1UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl;
  local_28.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
  .super__Head_base<0UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl._M_data =
       local_50.tracker.ranges.
       super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
       .super__Head_base<0UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl._M_data;
  local_28.tracker.current.super__Tuple_impl<0UL,_const_int_*,_const_int_*>.
  super__Tuple_impl<1UL,_const_int_*>.super__Head_base<1UL,_const_int_*,_false>._M_head_impl =
       (_Head_base<1UL,_const_int_*,_false>)
       (_Head_base<1UL,_const_int_*,_false>)
       local_50.tracker.ranges.
       super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
       .super__Tuple_impl<1UL,_std::reference_wrapper<const_int[3]>_>.
       super__Head_base<1UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl._M_data;
  local_28.tracker.current.super__Tuple_impl<0UL,_const_int_*,_const_int_*>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl =
       (int *)local_50.tracker.ranges.
              super__Tuple_impl<0UL,_std::reference_wrapper<const_int[3]>,_std::reference_wrapper<const_int[3]>_>
              .super__Head_base<0UL,_std::reference_wrapper<const_int[3]>,_false>._M_head_impl.
              _M_data;
  local_8 = local_30;
  bVar1 = iterator_concatenator<const_int[3],_const_int[3]>::operator!=(&local_28,&local_50);
  return !bVar1;
}

Assistant:

constexpr auto impl_empty(const T& t, priority_tag<0>) -> bool
    {
      using std::begin;
      using std::end;
      return !(begin(t) != end(t));
    }